

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array.cpp
# Opt level: O0

void __thiscall Omega_h::Write<long>::Write(Write<long> *this,HostWrite<long> *host_write)

{
  size_t in_RCX;
  void *in_RDX;
  Write<int> local_28;
  HostWrite<long> *local_18;
  HostWrite<long> *host_write_local;
  Write<long> *this_local;
  
  local_18 = host_write;
  host_write_local = (HostWrite<long> *)this;
  HostWrite<long>::write((HostWrite<long> *)&local_28,(int)host_write,in_RDX,in_RCX);
  Write(this,&local_28);
  ~Write((Write<long> *)&local_28);
  return;
}

Assistant:

Write<T>::Write(HostWrite<T> host_write) : Write<T>(host_write.write()) {}